

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O2

VkDescriptorSet * __thiscall
vkt::pipeline::multisample::MSInstanceSampleMaskPattern::createMSPassDescSet
          (MSInstanceSampleMaskPattern *this,ImageMSParams *imageMSParams,
          VkDescriptorSetLayout *descSetLayout)

{
  Move<vk::Handle<(vk::HandleType)22>_> *this_00;
  Allocation *pAVar1;
  PtrData<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_> data;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  DescriptorPoolBuilder *this_01;
  Buffer *this_02;
  DescriptorSetUpdateBuilder *this_03;
  Buffer *in_stack_ffffffffffffff18;
  VkBufferCreateInfo bufferSampleMaskInfo;
  DescriptorSetUpdateBuilder local_98;
  VkDescriptorBufferInfo descBufferInfo;
  Location local_38;
  
  vk = Context::getDeviceInterface
                 ((this->super_MSInstanceBaseResolveAndPerSampleFetch).super_MultisampleInstanceBase
                  .super_TestInstance.m_context);
  device = Context::getDevice((this->super_MSInstanceBaseResolveAndPerSampleFetch).
                              super_MultisampleInstanceBase.super_TestInstance.m_context);
  allocator = Context::getDefaultAllocator
                        ((this->super_MSInstanceBaseResolveAndPerSampleFetch).
                         super_MultisampleInstanceBase.super_TestInstance.m_context);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&descBufferInfo);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&descBufferInfo,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1)
  ;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&bufferSampleMaskInfo,this_01,vk,device,1,1);
  local_98.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bufferSampleMaskInfo._16_8_;
  local_98.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)bufferSampleMaskInfo.size;
  local_98.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)bufferSampleMaskInfo._0_8_;
  local_98.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)bufferSampleMaskInfo.pNext;
  bufferSampleMaskInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferSampleMaskInfo._4_4_ = 0;
  bufferSampleMaskInfo.pNext = (void *)0x0;
  bufferSampleMaskInfo.flags = 0;
  bufferSampleMaskInfo._20_4_ = 0;
  bufferSampleMaskInfo.size = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
            (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)
       local_98.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)
         local_98.m_writes.
         super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
         _M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       (deUint64)
       local_98.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_98.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&bufferSampleMaskInfo);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&descBufferInfo);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&bufferSampleMaskInfo,vk,device,
                    (VkDescriptorPool)
                    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                    object.m_internal,(VkDescriptorSetLayout)descSetLayout->m_internal);
  local_98.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bufferSampleMaskInfo._16_8_;
  local_98.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)bufferSampleMaskInfo.size;
  local_98.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)bufferSampleMaskInfo._0_8_;
  local_98.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)bufferSampleMaskInfo.pNext;
  bufferSampleMaskInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferSampleMaskInfo._4_4_ = 0;
  bufferSampleMaskInfo.pNext = (void *)0x0;
  bufferSampleMaskInfo.flags = 0;
  bufferSampleMaskInfo._20_4_ = 0;
  bufferSampleMaskInfo.size = 0;
  this_00 = &this->m_descriptorSet;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)
       local_98.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
  m_internal = (deUint64)
               local_98.m_writes.
               super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
               ._M_impl.super__Vector_impl_data._M_start;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
       (deUint64)
       local_98.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_98.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&bufferSampleMaskInfo);
  makeBufferCreateInfo(&bufferSampleMaskInfo,4,0x10);
  this_02 = (Buffer *)operator_new(0x30);
  pipeline::Buffer::Buffer(this_02,vk,device,allocator,&bufferSampleMaskInfo,(MemoryRequirement)0x1)
  ;
  local_98.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data._8_8_ = allocator;
  data.ptr = in_stack_ffffffffffffff18;
  de::details::UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>::
  assignData(&(this->m_buffer).
              super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>,
             data);
  de::details::UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>::
  ~UniqueBase((UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_> *)
              &local_98);
  *(undefined4 *)
   ((((this->m_buffer).
      super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>.m_data.ptr
     )->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
   ptr)->m_hostPtr =
       *(undefined4 *)
        &(this->super_MSInstanceBaseResolveAndPerSampleFetch).super_MultisampleInstanceBase.
         field_0x2c;
  pAVar1 = (((this->m_buffer).
             super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>.
             m_data.ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar1->m_memory).m_internal,pAVar1->m_offset,
             0xffffffffffffffff);
  descBufferInfo.buffer.m_internal =
       (((this->m_buffer).
         super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>.m_data.
        ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  descBufferInfo.offset = 0;
  descBufferInfo.range = 4;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_98);
  local_38.m_binding = 0;
  local_38.m_arrayElement = 0;
  this_03 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_98,
                       (VkDescriptorSet)
                       (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data
                       .object.m_internal,&local_38,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                       &descBufferInfo);
  ::vk::DescriptorSetUpdateBuilder::update(this_03,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_98);
  return (VkDescriptorSet *)this_00;
}

Assistant:

const VkDescriptorSet* MSInstanceSampleMaskPattern::createMSPassDescSet (const ImageMSParams& imageMSParams, const VkDescriptorSetLayout* descSetLayout)
{
	DE_UNREF(imageMSParams);

	const DeviceInterface&		deviceInterface = m_context.getDeviceInterface();
	const VkDevice				device			= m_context.getDevice();
	Allocator&					allocator		= m_context.getDefaultAllocator();

	// Create descriptor pool
	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, 1u)
		.build(deviceInterface, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

	// Create descriptor set
	m_descriptorSet = makeDescriptorSet(deviceInterface, device, *m_descriptorPool, *descSetLayout);

	const VkBufferCreateInfo bufferSampleMaskInfo = makeBufferCreateInfo(sizeof(VkSampleMask), VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);

	m_buffer = de::MovePtr<Buffer>(new Buffer(deviceInterface, device, allocator, bufferSampleMaskInfo, MemoryRequirement::HostVisible));

	deMemcpy(m_buffer->getAllocation().getHostPtr(), &m_sampleMask, sizeof(VkSampleMask));

	flushMappedMemoryRange(deviceInterface, device, m_buffer->getAllocation().getMemory(), m_buffer->getAllocation().getOffset(), VK_WHOLE_SIZE);

	const VkDescriptorBufferInfo descBufferInfo = makeDescriptorBufferInfo(**m_buffer, 0u, sizeof(VkSampleMask));

	DescriptorSetUpdateBuilder()
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descBufferInfo)
		.update(deviceInterface, device);

	return &m_descriptorSet.get();
}